

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void concept_const_suite::random_access_iterator_subtraction(void)

{
  ulong uVar1;
  ulong uVar2;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  undefined4 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  long local_20 [2];
  
  local_20[0] = 0x160000000b;
  local_20[1] = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)local_20;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,__l,(allocator_type *)&local_3c);
  uVar1 = (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar2 = (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
  if ((uVar2 & uVar2 - 1) == 0) {
    uVar1 = uVar2 - 1 & uVar1;
  }
  else {
    uVar1 = uVar1 % uVar2;
  }
  local_20[0] = uVar1 - 2;
  local_3c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), a)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1f8,"void concept_const_suite::random_access_iterator_subtraction()",local_20,
             (allocator_type *)&local_3c);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void random_access_iterator_subtraction()
{
    // a - n
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.end() - 2;
    BOOST_TEST_EQ(std::distance(span.begin(), a), 2);
}